

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

void __thiscall QIODevicePrivate::setReadChannelCount(QIODevicePrivate *this,int count)

{
  long lVar1;
  size_type sVar2;
  int in_ESI;
  QIODevicePrivate *in_RDI;
  long in_FS_OFFSET;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  QVarLengthArray<QRingBuffer,_2LL> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = QVLABaseBase::size(&(in_RDI->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase);
  if (sVar2 < in_ESI) {
    QVarLengthArray<QRingBuffer,_2LL>::reserve
              ((QVarLengthArray<QRingBuffer,_2LL> *)in_RDI,(qsizetype)in_stack_ffffffffffffffc8);
    while( true ) {
      iVar3 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
      sVar2 = QVLABaseBase::size(&(in_RDI->readBuffers).super_QVLABase<QRingBuffer>.
                                  super_QVLABaseBase);
      if (in_ESI <= sVar2) break;
      in_stack_ffffffffffffffc8 = &in_RDI->readBuffers;
      if (in_RDI->readBufferChunkSize == 0) {
        iVar3 = 0x4000;
      }
      else {
        iVar3 = in_RDI->readBufferChunkSize;
      }
      QVarLengthArray<QRingBuffer,_2LL>::emplace_back<int>
                ((QVarLengthArray<QRingBuffer,_2LL> *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
  }
  else {
    QVarLengthArray<QRingBuffer,_2LL>::resize
              ((QVarLengthArray<QRingBuffer,_2LL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (qsizetype)in_stack_ffffffffffffffb8);
    iVar3 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  }
  in_RDI->readChannelCount = in_ESI;
  setCurrentReadChannel(in_RDI,iVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIODevicePrivate::setReadChannelCount(int count)
{
    if (count > readBuffers.size()) {
        readBuffers.reserve(count);

        // If readBufferChunkSize is zero, we should bypass QIODevice's
        // read buffers, even if the QIODeviceBase::Unbuffered flag is not
        // set when opened. However, if a read transaction is started or
        // ungetChar() is called, we still have to use the internal buffer.
        // To support these cases, pass a default value to the QRingBuffer
        // constructor.

        while (readBuffers.size() < count)
            readBuffers.emplace_back(readBufferChunkSize != 0 ? readBufferChunkSize
                                                              : QIODEVICE_BUFFERSIZE);
    } else {
        readBuffers.resize(count);
    }
    readChannelCount = count;
    setCurrentReadChannel(currentReadChannel);
}